

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

int hanabi_learning_env::ParameterValue<int>
              (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *params,string *key,int default_value)

{
  int iVar1;
  char *__nptr;
  const_iterator cVar2;
  int *piVar3;
  ulong uVar4;
  undefined8 uVar5;
  char *local_30;
  
  uVar4 = (ulong)(uint)default_value;
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&params->_M_h,key);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
LAB_00117868:
    return (int)uVar4;
  }
  __nptr = *(char **)((long)cVar2.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                            ._M_cur + 0x28);
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  *piVar3 = 0;
  uVar4 = strtol(__nptr,&local_30,10);
  if (local_30 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((long)(int)uVar4 == uVar4) && (*piVar3 != 0x22)) {
    if (*piVar3 == 0) {
      *piVar3 = iVar1;
    }
    goto LAB_00117868;
  }
  uVar5 = std::__throw_out_of_range("stoi");
  if (*piVar3 == 0) {
    *piVar3 = iVar1;
  }
  _Unwind_Resume(uVar5);
}

Assistant:

int ParameterValue<int>(
    const std::unordered_map<std::string, std::string>& params,
    const std::string& key, int default_value) {
  auto iter = params.find(key);
  if (iter == params.end()) {
    return default_value;
  }

  return std::stoi(iter->second);
}